

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

int icu_63::double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  int iVar1;
  Chunk CVar2;
  Chunk CVar3;
  Chunk CVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Bignum *this;
  
  iVar1 = a->used_digits_;
  uVar10 = a->exponent_;
  do {
    uVar9 = uVar10;
    this = b;
    b = a;
    uVar7 = (ulong)uVar9;
    iVar8 = iVar1 + uVar9;
    iVar1 = this->used_digits_;
    uVar10 = this->exponent_;
    a = this;
  } while (iVar8 < (int)(uVar10 + iVar1));
  uVar5 = c->exponent_;
  iVar11 = c->used_digits_ + uVar5;
  iVar6 = -1;
  if (iVar11 <= iVar8 + 1) {
    if (iVar11 < iVar8) {
      iVar6 = 1;
    }
    else if (((int)uVar9 < (int)(uVar10 + iVar1)) || (iVar11 <= iVar8)) {
      if ((int)uVar9 < (int)uVar10) {
        uVar10 = uVar9;
      }
      if ((int)uVar5 <= (int)uVar10) {
        uVar10 = uVar5;
      }
      uVar9 = 0;
      while (iVar1 = (int)uVar7, (int)uVar10 < iVar11) {
        iVar1 = iVar11 + -1;
        CVar2 = BigitAt(b,iVar1);
        CVar3 = BigitAt(this,iVar1);
        CVar4 = BigitAt(c,iVar1);
        uVar5 = (CVar4 + uVar9) - (CVar3 + CVar2);
        if (CVar4 + uVar9 < CVar3 + CVar2) {
          iVar1 = 1;
          break;
        }
        if (1 < uVar5) {
          iVar1 = -1;
          uVar9 = uVar5;
          break;
        }
        uVar9 = uVar5 * 0x10000000;
        iVar11 = iVar1;
      }
      iVar6 = -(uint)(uVar9 != 0);
      if ((int)uVar10 < iVar11) {
        iVar6 = iVar1;
      }
    }
  }
  return iVar6;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  ASSERT(a.IsClamped());
  ASSERT(b.IsClamped());
  ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) return -1;
  if (a.BigitLength() > c.BigitLength()) return +1;
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  int min_exponent = Min(Min(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    Chunk chunk_a = a.BigitAt(i);
    Chunk chunk_b = b.BigitAt(i);
    Chunk chunk_c = c.BigitAt(i);
    Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) return 0;
  return -1;
}